

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# G1.c
# Opt level: O0

int G1_is_on_curve(G1 *op,ATE_CTX *ctx)

{
  int iVar1;
  long in_RSI;
  G1 tmp;
  fp_t ty;
  fp_t tx;
  G1 *in_stack_ffffffffffffff48;
  G1 *in_stack_ffffffffffffff50;
  fp_struct_st *in_stack_ffffffffffffff58;
  fp_struct_st *in_stack_ffffffffffffff60;
  ATE_CTX *in_stack_ffffffffffffff68;
  G1 *in_stack_ffffffffffffff70;
  fp_struct_st local_58;
  fp_struct_st local_38;
  long local_10;
  
  local_10 = in_RSI;
  G1_set(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  G1_makeaffine(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  fp_mul(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50->m_x,
         in_stack_ffffffffffffff48->m_x,(fp_struct_st *)0x125a9d);
  fp_mul(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50->m_x,
         in_stack_ffffffffffffff48->m_x,(fp_struct_st *)0x125ace);
  fp_mul(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50->m_x,
         in_stack_ffffffffffffff48->m_x,(fp_struct_st *)0x125b04);
  fp_add(&local_38,&local_38,local_10 + 0x2b0,local_10 + 0x2d0);
  iVar1 = fp_cmp(&local_38,&local_58);
  return (int)(iVar1 == 0);
}

Assistant:

int G1_is_on_curve(const G1 *op, const ATE_CTX *ctx)
{
    fp_t tx, ty;
    G1 tmp;
    G1_set(&tmp, op);
    G1_makeaffine(&tmp, ctx);

    fp_square(ty, tmp.m_y, ctx->p, ctx->n0); /* y^2 */
    fp_square(tx, tmp.m_x, ctx->p, ctx->n0);
    fp_mul(tx, tx, tmp.m_x, ctx->p, ctx->n0); /* x^3 */
    fp_add(tx, tx, ctx->b, ctx->p); /* x^3 + b */
    
    return fp_cmp(tx, ty) == 0;
}